

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newpfor.h
# Opt level: O1

void __thiscall
FastPForLib::NewPFor<4U,_FastPForLib::Simple16<false>_>::encodeBlock
          (NewPFor<4U,_FastPForLib::Simple16<false>_> *this,uint32_t *in,uint32_t *out,
          size_t *nvalue)

{
  pointer puVar1;
  pointer puVar2;
  pointer puVar3;
  uint *puVar4;
  sbyte sVar5;
  uint32_t i_1;
  uint bit;
  ulong uVar6;
  uint32_t i;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  uint32_t *out_00;
  int iVar10;
  uint32_t *puVar11;
  size_t encodedExceptions_sz;
  size_t local_50;
  uint32_t *local_48;
  size_t *local_40;
  NewPFor<4U,_FastPForLib::Simple16<false>_> *local_38;
  
  bit = (*(this->super_IntegerCODEC)._vptr_IntegerCODEC[9])(this,in,0x80);
  if (bit < 0x20) {
    local_50 = 0;
    sVar5 = ((byte)bit < 0x21) * (' ' - (byte)bit);
    puVar1 = (this->tobecoded).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar2 = (this->exceptionsPositions).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar3 = (this->exceptionsValues).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar7 = 0;
    uVar8 = 0;
    do {
      uVar9 = in[lVar7];
      if (uVar9 < (uint)(1 << (bit & 0x1f))) {
        puVar1[lVar7] = uVar9;
      }
      else {
        puVar1[lVar7] = uVar9 & (uint)(-1 << sVar5) >> sVar5;
        puVar2[uVar8] = (uint)lVar7;
        puVar3[uVar8] = in[lVar7] >> (bit & 0x1f);
        uVar8 = (ulong)((int)uVar8 + 1);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x80);
    iVar10 = (int)uVar8;
    local_40 = nvalue;
    if (iVar10 != 0) {
      if (iVar10 - 1U != 0) {
        puVar1 = (this->exceptionsPositions).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar8 = (ulong)(iVar10 - 1U);
        do {
          uVar6 = uVar8 - 1;
          puVar2 = puVar1 + uVar8;
          *puVar2 = *puVar2 - puVar1[uVar6 & 0xffffffff];
          uVar8 = uVar6;
        } while ((int)uVar6 != 0);
      }
      puVar1 = (this->exceptions).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      puVar4 = (this->exceptionsPositions).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar2 = (this->exceptionsValues).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar8 = 0;
      do {
        if (uVar8 == 0) {
          uVar9 = *puVar4;
        }
        else {
          uVar9 = puVar4[uVar8] - 1;
        }
        puVar1[uVar8] = uVar9;
        puVar1[(uint)(iVar10 + (int)uVar8)] = puVar2[uVar8] - 1;
        uVar8 = uVar8 + 1;
      } while (iVar10 + (uint)(iVar10 == 0) != uVar8);
      if (iVar10 != 0) {
        Simple16<false>::encodeArray
                  (&this->ecoder,
                   (this->exceptions).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start,(ulong)(uint)(iVar10 * 2),out + 1,&local_50);
      }
    }
    *out = iVar10 << 0x10 | bit << 0x1a | (uint)local_50;
    out_00 = out + (local_50 & 0xffffffff) + 1;
    uVar8 = 0xffffffffffffffe0;
    lVar7 = 0;
    puVar11 = out_00;
    local_48 = out;
    local_38 = this;
    do {
      fastpackwithoutmask((uint32_t *)
                          ((long)(local_38->tobecoded).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start + lVar7),out_00,bit);
      uVar8 = uVar8 + 0x20;
      lVar7 = lVar7 + 0x80;
      out_00 = out_00 + bit;
      puVar11 = puVar11 + bit;
    } while (uVar8 < 0x60);
    *local_40 = (long)puVar11 - (long)local_48 >> 2;
  }
  else {
    *out = bit << 0x1a;
    lVar7 = 0;
    do {
      out[lVar7 + 1] = in[lVar7];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x80);
    *nvalue = 0x81;
  }
  return;
}

Assistant:

void NewPFor<BlockSizeInUnitsOfPackSize, ExceptionCoder>::encodeBlock(
    const uint32_t *in, uint32_t *out, size_t &nvalue) {
  const uint32_t len = BlockSize;

  uint32_t b = findBestB(in, len);
  if (b < 32) {

    uint32_t nExceptions = 0;
    size_t encodedExceptions_sz = 0;

    const uint32_t *const initout(out);
    for (uint32_t i = 0; i < len; i++) {

      if (in[i] >= (1U << b)) {
        tobecoded[i] = in[i] & ((1U << b) - 1);
        exceptionsPositions[nExceptions] = i;
        exceptionsValues[nExceptions] = (in[i] >> b);
        nExceptions++;
      } else {
        tobecoded[i] = in[i];
      }
    }

    if (nExceptions > 0) {

      for (uint32_t i = nExceptions - 1; i > 0; i--) {
        const uint32_t cur = exceptionsPositions[i];
        const uint32_t prev = exceptionsPositions[i - 1];

        exceptionsPositions[i] = cur - prev;
      }

      for (uint32_t i = 0; i < nExceptions; i++) {

        exceptions[i] =
            (i > 0) ? exceptionsPositions[i] - 1 : exceptionsPositions[i];
        exceptions[i + nExceptions] = exceptionsValues[i] - 1;
      }
    }

    if (nExceptions > 0)
      ecoder.encodeArray(&exceptions[0], 2 * nExceptions, out + 1,
                         encodedExceptions_sz);
    *out++ = (b << (PFORDELTA_NEXCEPT + PFORDELTA_EXCEPTSZ)) |
             (nExceptions << PFORDELTA_EXCEPTSZ) |
             static_cast<uint32_t>(encodedExceptions_sz);
    /* Write exceptional values */

    out += static_cast<uint32_t>(encodedExceptions_sz);
    for (uint32_t i = 0; i < len; i += 32) {
      fastpackwithoutmask(&tobecoded[i], out, b);
      out += b;
    }
    nvalue = out - initout;

  } else {
    *out++ = (b << (PFORDELTA_NEXCEPT + PFORDELTA_EXCEPTSZ));
    for (uint32_t i = 0; i < len; i++)
      out[i] = in[i];
    nvalue = len + 1;
  }
}